

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O0

bool __thiscall
kj::_::Mutex::lock(Mutex *this,int exclusivity,
                  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> *timeout)

{
  uint uVar1;
  timespec *ptVar2;
  long lVar3;
  int *piVar4;
  bool bVar5;
  long result_1;
  uint local_a0;
  uint state_1;
  long result;
  uint local_7c;
  uint state;
  timespec *s;
  timespec *_s173;
  timespec *specp;
  anon_class_1_0_00000001 local_49;
  undefined1 local_48 [8];
  Maybe<timespec> spec;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_c__:169:3)>
  _kjDefer169;
  BlockedOnReason blockReason;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> *timeout_local;
  Exclusivity exclusivity_local;
  Mutex *this_local;
  
  BlockedOnMutexAcquisition::BlockedOnMutexAcquisition();
  BlockedOnReason::BlockedOnReason
            ((BlockedOnReason *)((long)&spec.ptr.field_1 + 0xf),
             (BlockedOnMutexAcquisition *)((long)&spec.ptr.field_1 + 0xe));
  defer<kj::_::Mutex::lock(kj::_::Mutex::Exclusivity,kj::Maybe<kj::Quantity<long,kj::_::NanosecondLabel>>,kj::NoopSourceLocation)::__0>
            ((kj *)((long)&spec.ptr.field_1 + 0xb),(Type *)((long)&spec.ptr.field_1 + 10));
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::
  map<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_c__:171:27)>
            ((Maybe<timespec> *)local_48,timeout,&local_49);
  _s173 = (timespec *)0x0;
  ptVar2 = readMaybe<timespec>((Maybe<timespec> *)local_48);
  if (ptVar2 != (timespec *)0x0) {
    _s173 = ptVar2;
  }
  if (exclusivity == 0) {
LAB_00854ed9:
    do {
      LOCK();
      local_7c = this->futex;
      bVar5 = local_7c == 0;
      if (bVar5) {
        this->futex = 0x80000000;
        local_7c = 0;
      }
      UNLOCK();
      if (bVar5) goto LAB_008551be;
      if ((local_7c & 0x40000000) == 0) {
        LOCK();
        bVar5 = local_7c == this->futex;
        if (bVar5) {
          this->futex = local_7c | 0x40000000;
        }
        UNLOCK();
        if (!bVar5) goto LAB_00854ed9;
        local_7c = local_7c | 0x40000000;
      }
      setCurrentThreadIsWaitingFor((BlockedOnReason *)((long)&spec.ptr.field_1 + 0xf));
      lVar3 = syscall(0xca,this,0x80,(ulong)local_7c,_s173,0,0);
    } while ((-1 < lVar3) || (piVar4 = __errno_location(), *piVar4 != 0x6e));
    setCurrentThreadIsNoLongerWaiting();
    this_local._7_1_ = false;
  }
  else {
    if (exclusivity == 1) {
      LOCK();
      local_a0 = this->futex;
      this->futex = this->futex + 1;
      UNLOCK();
      local_a0 = local_a0 + 1;
      while ((local_a0 & 0x80000000) != 0) {
        setCurrentThreadIsWaitingFor((BlockedOnReason *)((long)&spec.ptr.field_1 + 0xf));
        lVar3 = syscall(0xca,this,0x80,(ulong)local_a0,_s173,0,0);
        if ((lVar3 < 0) && (piVar4 = __errno_location(), *piVar4 == 0x6e)) {
          setCurrentThreadIsNoLongerWaiting();
          LOCK();
          uVar1 = this->futex;
          this->futex = this->futex - 1;
          UNLOCK();
          if (uVar1 == 0x40000001) {
            LOCK();
            bVar5 = this->futex == 0x40000000;
            if (bVar5) {
              this->futex = 0;
            }
            UNLOCK();
            if (bVar5) {
              syscall(0xca,this,0x81,0x7fffffff,0,0,0);
            }
          }
          this_local._7_1_ = false;
          goto LAB_008551cc;
        }
        local_a0 = this->futex;
      }
    }
LAB_008551be:
    this_local._7_1_ = true;
  }
LAB_008551cc:
  Maybe<timespec>::~Maybe((Maybe<timespec> *)local_48);
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++:169:3)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_c__:169:3)>
               *)((long)&spec.ptr.field_1 + 0xb));
  return this_local._7_1_;
}

Assistant:

bool Mutex::lock(Exclusivity exclusivity, Maybe<Duration> timeout, LockSourceLocationArg location) {
  BlockedOnReason blockReason = BlockedOnMutexAcquisition{*this, location};
  KJ_DEFER(setCurrentThreadIsNoLongerWaiting());

  auto spec = timeout.map([](Duration d) { return toRelativeTimespec(d); });
  struct timespec* specp = nullptr;
  KJ_IF_SOME(s, spec) {
    specp = &s;
  }

  switch (exclusivity) {
    case EXCLUSIVE:
      for (;;) {
        uint state = 0;
        if (KJ_LIKELY(__atomic_compare_exchange_n(&futex, &state, EXCLUSIVE_HELD, false,
                                                  __ATOMIC_ACQUIRE, __ATOMIC_RELAXED))) {

          // Acquired.
          break;
        }

        // The mutex is contended.  Set the exclusive-requested bit and wait.
        if ((state & EXCLUSIVE_REQUESTED) == 0) {
          if (!__atomic_compare_exchange_n(&futex, &state, state | EXCLUSIVE_REQUESTED, false,
                                           __ATOMIC_RELAXED, __ATOMIC_RELAXED)) {
            // Oops, the state changed before we could set the request bit.  Start over.
            continue;
          }

          state |= EXCLUSIVE_REQUESTED;
        }

        setCurrentThreadIsWaitingFor(&blockReason);

        auto result = syscall(SYS_futex, &futex, FUTEX_WAIT_PRIVATE, state, specp, nullptr, 0);
        if (result < 0) {
          if (errno == ETIMEDOUT) {
            setCurrentThreadIsNoLongerWaiting();
            // We timed out, we can't remove the exclusive request flag (since others might be waiting)
            // so we just return false.
            return false;
          }
        }
      }
#if KJ_CONTENTION_WARNING_THRESHOLD
      printContendedReader = false;
#endif
      break;
    case SHARED: {
#if KJ_CONTENTION_WARNING_THRESHOLD
      kj::Maybe<kj::TimePoint> contentionWaitStart;
#endif

      uint state = __atomic_add_fetch(&futex, 1, __ATOMIC_ACQUIRE);

      for (;;) {
        if (KJ_LIKELY((state & EXCLUSIVE_HELD) == 0)) {
          // Acquired.
          break;
        }

#if KJ_CONTENTION_WARNING_THRESHOLD
        if (contentionWaitStart == kj::none) {
          // We could have the exclusive mutex tell us how long it was holding the lock. That would
          // be the nicest. However, I'm hesitant to bloat the structure. I suspect having a reader
          // tell us how long it was waiting for is probably a good proxy.
          contentionWaitStart = kj::systemPreciseMonotonicClock().now();
        }
#endif

        setCurrentThreadIsWaitingFor(&blockReason);

        // The mutex is exclusively locked by another thread.  Since we incremented the counter
        // already, we just have to wait for it to be unlocked.
        auto result = syscall(SYS_futex, &futex, FUTEX_WAIT_PRIVATE, state, specp, nullptr, 0);
        if (result < 0) {
          // If we timeout though, we need to signal that we're not waiting anymore.
          if (errno == ETIMEDOUT) {
            setCurrentThreadIsNoLongerWaiting();
            state = __atomic_sub_fetch(&futex, 1, __ATOMIC_RELAXED);

            // We may have unlocked since we timed out. So act like we just unlocked the mutex
            // and maybe send a wait signal if needed. See Mutex::unlock SHARED case.
            if (KJ_UNLIKELY(state == EXCLUSIVE_REQUESTED)) {
              if (__atomic_compare_exchange_n(
                  &futex, &state, 0, false, __ATOMIC_RELAXED, __ATOMIC_RELAXED)) {
                // Wake all exclusive waiters.  We have to wake all of them because one of them will
                // grab the lock while the others will re-establish the exclusive-requested bit.
                syscall(SYS_futex, &futex, FUTEX_WAKE_PRIVATE, INT_MAX, nullptr, nullptr, 0);
              }
            }
            return false;
          }
        }
        state = __atomic_load_n(&futex, __ATOMIC_ACQUIRE);
      }

#ifdef KJ_CONTENTION_WARNING_THRESHOLD
      KJ_IF_SOME(start, contentionWaitStart) {
        if (__atomic_load_n(&printContendedReader, __ATOMIC_RELAXED)) {
          // Double-checked lock avoids the CPU needing to acquire the lock in most cases.
          if (__atomic_exchange_n(&printContendedReader, false, __ATOMIC_RELAXED)) {
            auto contentionDuration = kj::systemPreciseMonotonicClock().now() - start;
            KJ_LOG(WARNING, "Acquired contended lock", location, contentionDuration,
                kj::getStackTrace());
          }
        }
      }
#endif

      break;
    }
  }
  return true;
}